

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> * __thiscall
cmLocalGenerator::AddUnityFilesModeGroup
          (vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *lang,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                   *filtered_sources,cmValue beforeInclude,cmValue afterInclude,
          string *filename_base)

{
  pointer *ppUVar1;
  UnityBatchedSource *pUVar2;
  cmSourceFile *this_00;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  cmValue __k;
  iterator iVar6;
  UnityBatchedSource *__args;
  __node_base _Var7;
  char *__end;
  initializer_list<cmLocalGenerator::UnityBatchedSource> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  allocator_type local_111;
  vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> *local_110;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  sources;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Hash_node_base *local_c8;
  _Hash_node_base *local_c0;
  long local_b8;
  char *local_b0;
  undefined1 local_a8 [17];
  undefined7 uStack_97;
  cmLocalGenerator *local_88;
  cmGeneratorTarget *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  string *local_70;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>_>
  explicit_mapping;
  
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  explicit_mapping._M_h._M_buckets = &explicit_mapping._M_h._M_single_bucket;
  explicit_mapping._M_h._M_bucket_count = 1;
  explicit_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  explicit_mapping._M_h._M_element_count = 0;
  explicit_mapping._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  explicit_mapping._M_h._M_rehash_policy._M_next_resize = 0;
  explicit_mapping._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __args = (filtered_sources->
           super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (filtered_sources->
           super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_110 = __return_storage_ptr__;
  local_88 = this;
  local_80 = target;
  local_78 = configs;
  local_70 = lang;
  if (__args != pUVar2) {
    do {
      this_00 = __args->Source;
      local_e8._0_8_ = &local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"UNITY_GROUP","");
      __k = cmSourceFile::GetProperty(this_00,(string *)local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ != &local_d8) {
        operator_delete((void *)local_e8._0_8_,local_d8._M_allocated_capacity + 1);
      }
      if (__k.Value != (string *)0x0) {
        iVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&explicit_mapping._M_h,__k.Value);
        if (iVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_e8._0_8_ = __args->Source;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_e8 + 8),
                     &__args->Configs);
          __l._M_len = 1;
          __l._M_array = (iterator)local_e8;
          std::
          vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
          ::vector(&sources,__l,&local_111);
          if ((pointer)local_e8._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_e8._8_8_,local_d8._8_8_ - local_e8._8_8_);
          }
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::__cxx11::string_const&,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&explicit_mapping,__k.Value,&sources);
          std::
          vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
          ::~vector(&sources);
        }
        else {
          std::
          vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
          ::emplace_back<cmLocalGenerator::UnityBatchedSource_const&>
                    ((vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
                      *)((long)iVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_true>
                               ._M_cur + 0x28),__args);
        }
      }
      __args = __args + 1;
    } while (__args != pUVar2);
  }
  if (explicit_mapping._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    ppUVar1 = &sources.
               super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    _Var7._M_nxt = explicit_mapping._M_h._M_before_begin._M_nxt;
    do {
      pcVar3 = (filename_base->_M_dataplus)._M_p;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)filename_base->_M_string_length;
      iVar5 = std::__cxx11::string::compare((char *)local_70);
      local_b0 = "_cxx.cxx";
      if (iVar5 == 0) {
        local_b0 = "_c.c";
      }
      local_d8._M_allocated_capacity = 6;
      local_d8._8_8_ = (long)" unity_" + 1;
      local_c0 = _Var7._M_nxt[1]._M_nxt;
      local_c8 = _Var7._M_nxt[2]._M_nxt;
      local_b8 = (ulong)(iVar5 != 0) * 4 + 4;
      views._M_len = 4;
      views._M_array = (iterator)local_e8;
      local_e8._0_8_ = paVar4;
      local_e8._8_8_ = pcVar3;
      cmCatViews_abi_cxx11_((string *)&sources,views);
      local_a8._0_8_ = (pointer)(local_a8 + 0x10);
      if (sources.
          super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppUVar1) {
        local_a8._0_8_ =
             sources.
             super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      uStack_97 = sources.
                  super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_;
      local_a8[0x10] =
           sources.
           super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_;
      local_a8._8_8_ =
           sources.
           super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppUVar1;
      WriteUnitySource((UnitySource *)local_e8,local_88,local_80,local_78,
                       *(cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
                         *)(_Var7._M_nxt + 5),beforeInclude,afterInclude,(string *)local_a8);
      std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
      emplace_back<cmLocalGenerator::UnitySource>(local_110,(UnitySource *)local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ != &local_d8) {
        operator_delete((void *)local_e8._0_8_,local_d8._M_allocated_capacity + 1);
      }
      if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,stack0xffffffffffffff68 + 1);
      }
      if (sources.
          super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppUVar1) {
        operator_delete(sources.
                        super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT71(sources.
                                 super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 sources.
                                 super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
      }
      _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt;
    } while (_Var7._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&explicit_mapping._M_h);
  return local_110;
}

Assistant:

std::vector<cmLocalGenerator::UnitySource>
cmLocalGenerator::AddUnityFilesModeGroup(
  cmGeneratorTarget* target, std::string const& lang,
  std::vector<std::string> const& configs,
  std::vector<UnityBatchedSource> const& filtered_sources,
  cmValue beforeInclude, cmValue afterInclude,
  std::string const& filename_base)
{
  std::vector<UnitySource> unity_files;

  // sources organized by group name. Drop any source
  // without a group
  std::unordered_map<std::string, std::vector<UnityBatchedSource>>
    explicit_mapping;
  for (UnityBatchedSource const& ubs : filtered_sources) {
    if (cmValue value = ubs.Source->GetProperty("UNITY_GROUP")) {
      auto i = explicit_mapping.find(*value);
      if (i == explicit_mapping.end()) {
        std::vector<UnityBatchedSource> sources{ ubs };
        explicit_mapping.emplace(*value, std::move(sources));
      } else {
        i->second.emplace_back(ubs);
      }
    }
  }

  for (auto const& item : explicit_mapping) {
    auto const& name = item.first;
    std::string filename = cmStrCat(filename_base, "unity_", name,
                                    (lang == "C") ? "_c.c" : "_cxx.cxx");
    unity_files.emplace_back(this->WriteUnitySource(
      target, configs, cmMakeRange(item.second), beforeInclude, afterInclude,
      std::move(filename)));
  }

  return unity_files;
}